

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadAiger.c
# Opt level: O0

uint Io_ReadAigerDecode(char **ppPos)

{
  byte bVar1;
  byte *pbVar2;
  char cVar3;
  uint uStack_14;
  uchar ch;
  uint i;
  uint x;
  char **ppPos_local;
  
  uStack_14 = 0;
  cVar3 = '\0';
  while( true ) {
    pbVar2 = (byte *)*ppPos;
    *ppPos = (char *)(pbVar2 + 1);
    bVar1 = *pbVar2;
    if ((bVar1 & 0x80) == 0) break;
    uStack_14 = (bVar1 & 0x7f) << (cVar3 * '\a' & 0x1fU) | uStack_14;
    cVar3 = cVar3 + '\x01';
  }
  return uStack_14 | (uint)bVar1 << (cVar3 * '\a' & 0x1fU);
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Extracts one unsigned AIG edge from the input buffer.]

  Description [This procedure is a slightly modified version of Armin Biere's
  procedure "unsigned decode (FILE * file)". ]
  
  SideEffects [Updates the current reading position.]

  SeeAlso     []

***********************************************************************/
static inline unsigned Io_ReadAigerDecode( char ** ppPos )
{
    unsigned x = 0, i = 0;
    unsigned char ch;

//    while ((ch = getnoneofch (file)) & 0x80)
    while ((ch = *(*ppPos)++) & 0x80)
        x |= (ch & 0x7f) << (7 * i++);

    return x | (ch << (7 * i));
}